

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.cc
# Opt level: O1

void __thiscall Override::printRaw(Override *this,ostream *s,Architecture *glb)

{
  AddrSpace *pAVar1;
  FuncProto *this_00;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  pointer piVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  _Rb_tree_header *p_Var8;
  string local_50;
  
  p_Var8 = &(this->forcegoto)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->forcegoto)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var8;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::__ostream_insert<char,std::char_traits<char>>(s,"force goto at ",0xe);
    poVar2 = operator<<(s,(Address *)(p_Var3 + 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," jumping to ",0xc);
    poVar2 = operator<<(poVar2,(Address *)&p_Var3[1]._M_left);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  piVar4 = (this->deadcodedelay).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->deadcodedelay).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    uVar7 = 0;
    do {
      if (-1 < piVar4[uVar7]) {
        pAVar1 = (glb->super_AddrSpaceManager).baselist.
                 super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
        std::__ostream_insert<char,std::char_traits<char>>(s,"dead code delay on ",0x13);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (s,(pAVar1->name)._M_dataplus._M_p,(pAVar1->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," set to ",8);
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        plVar5 = (long *)std::ostream::operator<<
                                   (poVar2,(this->deadcodedelay).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start[uVar7]);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
      }
      uVar7 = uVar7 + 1;
      piVar4 = (this->deadcodedelay).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->deadcodedelay).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar4 >> 2));
  }
  for (p_Var3 = (this->forcegoto)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var8;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::__ostream_insert<char,std::char_traits<char>>(s,"override indirect at ",0x15);
    poVar2 = operator<<(s,(Address *)(p_Var3 + 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," to call directly to ",0x15);
    poVar2 = operator<<(poVar2,(Address *)&p_Var3[1]._M_left);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  p_Var6 = (this->protoover)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->protoover)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(s,"override prototype at ",0x16);
      poVar2 = operator<<(s,(Address *)(p_Var6 + 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," to ",4);
      this_00 = (FuncProto *)p_Var6[1]._M_left;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"func","");
      FuncProto::printRaw(this_00,&local_50,s);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + (char)s);
      std::ostream::put((char)s);
      std::ostream::flush();
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  return;
}

Assistant:

void Override::printRaw(ostream &s,Architecture *glb) const

{
  map<Address,Address>::const_iterator iter;

  for(iter=forcegoto.begin();iter!=forcegoto.end();++iter)
    s << "force goto at " << (*iter).first << " jumping to " << (*iter).second << endl;

  for(int4 i=0;i<deadcodedelay.size();++i) {
    if (deadcodedelay[i] < 0) continue;
    AddrSpace *spc = glb->getSpace(i);
    s << "dead code delay on " << spc->getName() << " set to " << dec << deadcodedelay[i] << endl;
  }

  for(iter=forcegoto.begin();iter!=forcegoto.end();++iter)
    s << "override indirect at " << (*iter).first << " to call directly to " << (*iter).second << endl;

  map<Address,FuncProto *>::const_iterator fiter;

  for(fiter=protoover.begin();fiter!=protoover.end();++fiter) {
    s << "override prototype at " << (*fiter).first << " to ";
    (*fiter).second->printRaw("func",s);
    s << endl;
  }
}